

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O2

Index __thiscall
BayesianGameCollaborativeGraphical::JointToGroupActionIndex
          (BayesianGameCollaborativeGraphical *this,Index e,Index jaI)

{
  BayesianGameIdenticalPayoff *pBVar1;
  Index IVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> restrictedIndivActions;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_48;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  BayesianGameBase::JointToIndividualActionIndices
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,
             (BayesianGameBase *)this,jaI);
  RestrictIndividualIndicesToScope<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_48,this,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,e);
  pBVar1 = (this->_m_LRFs).
           super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
           ._M_impl.super__Vector_impl_data._M_start[e];
  IVar2 = (**(code **)(*(long *)&(pBVar1->super_BayesianGameIdenticalPayoffInterface).
                                 super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure
                      + 0x38))(pBVar1,&_Stack_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
  return IVar2;
}

Assistant:

Index BayesianGameCollaborativeGraphical::
JointToGroupActionIndex(Index e, Index jaI) const
{
    const vector<Index> &indActions = JointToIndividualActionIndices(jaI);
    vector<Index> restrictedIndivActions = RestrictIndividualIndicesToScope(
            indActions, e);    
    Index jaGI = _m_LRFs[e]->
        IndividualToJointActionIndices(restrictedIndivActions);
    return(jaGI);
}